

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_MultipleSubcomMatchingWithCaseInplace_Test::TestBody
          (TApp_MultipleSubcomMatchingWithCaseInplace_Test *this)

{
  bool bVar1;
  App *pAVar2;
  AssertHelper local_f0;
  Message local_e8 [2];
  OptionAlreadyAdded *anon_var_0;
  char *pcStack_d0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_c0;
  allocator local_99;
  string local_98;
  App *local_78;
  App *first;
  string local_68;
  allocator local_31;
  string local_30;
  TApp_MultipleSubcomMatchingWithCaseInplace_Test *local_10;
  TApp_MultipleSubcomMatchingWithCaseInplace_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"first",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"",(allocator *)((long)&first + 7));
  CLI::App::add_subcommand(&(this->super_TApp).app,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&first + 7));
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"fIrst",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)((long)&gtest_msg.value + 7));
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_78 = pAVar2;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff30,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff30);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::App::ignore_case(local_78,true);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      return;
    }
    pcStack_d0 = 
    "Expected: first->ignore_case() throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_e8);
  testing::internal::AssertHelper::AssertHelper
            (&local_f0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x60,pcStack_d0);
  testing::internal::AssertHelper::operator=(&local_f0,local_e8);
  testing::internal::AssertHelper::~AssertHelper(&local_f0);
  testing::Message::~Message(local_e8);
  return;
}

Assistant:

TEST_F(TApp, MultipleSubcomMatchingWithCaseInplace) {
    app.add_subcommand("first");
    auto first = app.add_subcommand("fIrst");

    EXPECT_THROW(first->ignore_case(), CLI::OptionAlreadyAdded);
}